

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_dimension_add_t1stem
                   (PS_Dimension dim,FT_Int pos,FT_Int len,FT_Memory memory,FT_UInt *aindex)

{
  uint uVar1;
  uint uVar2;
  FT_Error FVar3;
  PS_Hint block;
  uint uVar4;
  FT_Int *pFVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  int local_4c;
  FT_Memory local_48;
  FT_UInt *local_40;
  PS_Mask mask;
  
  uVar4 = 0;
  iVar6 = 0;
  if (0 < len) {
    iVar6 = len;
  }
  bVar9 = len == -0x15;
  iVar8 = pos + -0x15;
  if (!bVar9) {
    iVar8 = pos;
  }
  uVar1 = (dim->hints).num_hints;
  block = (dim->hints).hints;
  pFVar5 = &block->len;
  for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    if ((((PS_HintRec_ *)(pFVar5 + -1))->pos == iVar8) && (*pFVar5 == iVar6)) goto LAB_001fca54;
    pFVar5 = pFVar5 + 3;
  }
  uVar4 = uVar1 + 1;
  uVar2 = (dim->hints).max_hints;
  if (uVar2 < uVar4) {
    uVar7 = (uVar1 & 0xfffffff8) + 8;
    local_48 = memory;
    local_40 = aindex;
    block = (PS_Hint)ft_mem_qrealloc(memory,0xc,(ulong)uVar2,(ulong)uVar7,block,&local_4c);
    (dim->hints).hints = block;
    if (local_4c != 0) {
      return local_4c;
    }
    (dim->hints).max_hints = uVar7;
    memory = local_48;
    aindex = local_40;
  }
  (dim->hints).num_hints = uVar4;
  block[(ulong)uVar4 - 1].pos = iVar8;
  block[(ulong)uVar4 - 1].len = iVar6;
  block[(ulong)uVar4 - 1].flags = len >> 0x1f & bVar9 + 1 + (uint)bVar9;
  uVar4 = uVar1;
LAB_001fca54:
  FVar3 = ps_mask_table_last(&dim->masks,memory,&mask);
  if (((FVar3 == 0) && (FVar3 = ps_mask_set_bit(mask,uVar4,memory), FVar3 == 0)) &&
     (FVar3 = 0, aindex != (FT_UInt *)0x0)) {
    *aindex = uVar4;
  }
  return FVar3;
}

Assistant:

static FT_Error
  ps_dimension_add_t1stem( PS_Dimension  dim,
                           FT_Int        pos,
                           FT_Int        len,
                           FT_Memory     memory,
                           FT_UInt      *aindex )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   flags = 0;


    /* detect ghost stem */
    if ( len < 0 )
    {
      flags |= PS_HINT_FLAG_GHOST;
      if ( len == -21 )
      {
        flags |= PS_HINT_FLAG_BOTTOM;
        pos    = ADD_INT( pos, len );
      }
      len = 0;
    }

    /* now, lookup stem in the current hints table */
    {
      PS_Mask  mask;
      FT_UInt  idx;
      FT_UInt  max  = dim->hints.num_hints;
      PS_Hint  hint = dim->hints.hints;


      for ( idx = 0; idx < max; idx++, hint++ )
      {
        if ( hint->pos == pos && hint->len == len )
          break;
      }

      /* we need to create a new hint in the table */
      if ( idx >= max )
      {
        error = ps_hint_table_alloc( &dim->hints, memory, &hint );
        if ( error )
          goto Exit;

        hint->pos   = pos;
        hint->len   = len;
        hint->flags = flags;
      }

      /* now, store the hint in the current mask */
      error = ps_mask_table_last( &dim->masks, memory, &mask );
      if ( error )
        goto Exit;

      error = ps_mask_set_bit( mask, idx, memory );
      if ( error )
        goto Exit;

      if ( aindex )
        *aindex = idx;
    }

  Exit:
    return error;
  }